

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O0

BoundLimitNode *
duckdb::BoundLimitNode::ExpressionValue
          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression
          )

{
  BoundLimitNode *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffffb8;
  BoundLimitNode *expression_p;
  BoundLimitNode *this;
  
  this = (BoundLimitNode *)&stack0xffffffffffffffe8;
  expression_p = in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)in_RDI
             ,in_stack_ffffffffffffffb8);
  BoundLimitNode(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)expression_p,SUB81((ulong)in_RDI >> 0x38,0));
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xe6bd67);
  return in_RDI;
}

Assistant:

BoundLimitNode BoundLimitNode::ExpressionValue(unique_ptr<Expression> expression) {
	return BoundLimitNode(std::move(expression), false);
}